

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O0

bool __thiscall lzham::symbol_codec::assemble_output_buf(symbol_codec *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  output_symbol *poVar5;
  byte *pbVar6;
  long in_RDI;
  uint bit;
  uint x;
  uint c_1;
  uint c;
  uint i;
  output_symbol *sym;
  uint sym_index;
  uint arith_buf_ofs;
  uint in_stack_000001a4;
  char *in_stack_000001a8;
  char *in_stack_000001b0;
  uint in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  uint in_stack_ffffffffffffffb8;
  uint local_24;
  uint local_18;
  uint local_14;
  
  *(undefined4 *)(in_RDI + 0x98) = 0;
  local_14 = 0;
  local_18 = 0;
  do {
    uVar4 = local_18;
    uVar2 = vector<lzham::symbol_codec::output_symbol>::size
                      ((vector<lzham::symbol_codec::output_symbol> *)(in_RDI + 0x80));
    if (uVar2 <= uVar4) {
      bVar1 = flush_bits((symbol_codec *)0x129330);
      return bVar1;
    }
    poVar5 = vector<lzham::symbol_codec::output_symbol>::operator[]
                       ((vector<lzham::symbol_codec::output_symbol> *)(in_RDI + 0x80),local_18);
    if (poVar5->m_num_bits == -2) {
      bVar1 = put_bits_align_to_byte((symbol_codec *)CONCAT44(uVar4,in_stack_ffffffffffffffb8));
      if (!bVar1) {
        return false;
      }
    }
    else if (poVar5->m_num_bits == -3) {
      uVar2 = vector<unsigned_char>::size((vector<unsigned_char> *)(in_RDI + 0x68));
      if (uVar2 != 0) {
        *(undefined4 *)(in_RDI + 0xa4) = 0xffffffff;
        *(undefined4 *)(in_RDI + 0xa0) = 0;
        for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
          pbVar6 = vector<unsigned_char>::operator[]
                             ((vector<unsigned_char> *)(in_RDI + 0x68),local_14);
          *(uint *)(in_RDI + 0xa0) = *(int *)(in_RDI + 0xa0) << 8 | (uint)*pbVar6;
          bVar1 = put_bits((symbol_codec *)CONCAT44(uVar4,in_stack_ffffffffffffffb8),
                           in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
          if (!bVar1) {
            return false;
          }
          local_14 = local_14 + 1;
        }
      }
    }
    else if (poVar5->m_num_bits == -1) {
      uVar3 = *(uint *)(in_RDI + 0xa4);
      while (uVar3 < 0x1000000) {
        in_stack_ffffffffffffffb8 = local_14;
        uVar2 = vector<unsigned_char>::size((vector<unsigned_char> *)(in_RDI + 0x68));
        if (in_stack_ffffffffffffffb8 < uVar2) {
          pbVar6 = vector<unsigned_char>::operator[]
                             ((vector<unsigned_char> *)(in_RDI + 0x68),local_14);
          uVar3 = (uint)*pbVar6;
          local_14 = local_14 + 1;
        }
        else {
          uVar3 = 0;
        }
        in_stack_ffffffffffffffb4 = uVar3;
        bVar1 = put_bits((symbol_codec *)CONCAT44(uVar4,in_stack_ffffffffffffffb8),uVar3,
                         in_stack_ffffffffffffffb0);
        if (!bVar1) {
          return false;
        }
        *(uint *)(in_RDI + 0xa0) = *(int *)(in_RDI + 0xa0) << 8 | uVar3;
        uVar3 = *(int *)(in_RDI + 0xa4) << 8;
        *(uint *)(in_RDI + 0xa4) = uVar3;
      }
      uVar3 = (uint)poVar5->m_arith_prob0 * (*(uint *)(in_RDI + 0xa4) >> 0xb);
      uVar4 = (uint)(uVar3 <= *(uint *)(in_RDI + 0xa0));
      if (uVar4 == 0) {
        *(uint *)(in_RDI + 0xa4) = uVar3;
      }
      else {
        *(uint *)(in_RDI + 0xa0) = *(int *)(in_RDI + 0xa0) - uVar3;
        *(uint *)(in_RDI + 0xa4) = *(int *)(in_RDI + 0xa4) - uVar3;
      }
      if (uVar4 != poVar5->m_bits) {
        lzham_assert(in_stack_000001b0,in_stack_000001a8,in_stack_000001a4);
      }
    }
    else {
      bVar1 = put_bits((symbol_codec *)CONCAT44(uVar4,in_stack_ffffffffffffffb8),
                       in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
      if (!bVar1) {
        return false;
      }
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

bool symbol_codec::assemble_output_buf()
   {
      m_total_bits_written = 0;

      uint arith_buf_ofs = 0;

      // Intermix the final Arithmetic, Huffman, or plain bits to a single combined bitstream.
      // All bits from each source must be output in exactly the same order that the decompressor will read them.
      for (uint sym_index = 0; sym_index < m_output_syms.size(); sym_index++)
      {
         const output_symbol& sym = m_output_syms[sym_index];

         if (sym.m_num_bits == output_symbol::cAlignToByteSym)
         {
            if (!put_bits_align_to_byte())
            {
               LZHAM_LOG_ERROR(4026);
               return false;
            }
         }
         else if (sym.m_num_bits == output_symbol::cArithInit)
         {
            LZHAM_ASSERT(m_arith_output_buf.size());

            if (m_arith_output_buf.size())
            {
               m_arith_length = cSymbolCodecArithMaxLen;
               m_arith_value = 0;
               for (uint i = 0; i < 4; i++)
               {
                  const uint c = m_arith_output_buf[arith_buf_ofs++];
                  m_arith_value = (m_arith_value << 8) | c;
                  if (!put_bits(c, 8))
                  {
                     LZHAM_LOG_ERROR(4027);
                     return false;
                  }
               }
            }
         }
         else if (sym.m_num_bits == output_symbol::cArithSym)
         {
            // This renorm logic must match the logic used in the arithmetic decoder.
            if (m_arith_length < cSymbolCodecArithMinLen)
            {
               do
               {
                  const uint c = (arith_buf_ofs < m_arith_output_buf.size()) ? m_arith_output_buf[arith_buf_ofs++] : 0;
                  if (!put_bits(c, 8))
                  {
                     LZHAM_LOG_ERROR(4028);
                     return false;
                  }
                  m_arith_value = (m_arith_value << 8) | c;
               } while ((m_arith_length <<= 8) < cSymbolCodecArithMinLen);
            }

            uint x = sym.m_arith_prob0 * (m_arith_length >> cSymbolCodecArithProbBits);
            uint bit = (m_arith_value >= x);

            if (bit == 0)
            {
               m_arith_length = x;
            }
            else
            {
               m_arith_value  -= x;
               m_arith_length -= x;
            }

            LZHAM_VERIFY(bit == sym.m_bits);
         }
         else
         {
            // Huffman or plain bits
            if (!put_bits(sym.m_bits, sym.m_num_bits))
            {
               LZHAM_LOG_ERROR(4029);
               return false;
            }
         }
      }

      return flush_bits();
   }